

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h263d_parser.c
# Opt level: O2

MPP_RET mpp_h263_parser_setup_refer(H263dParser ctx,RK_S32 *refer,RK_S32 max_ref)

{
  RK_S32 index;
  MppBufSlots slots;
  
  slots = *ctx;
  if (((byte)h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"in\n","mpp_h263_parser_setup_refer");
  }
  refer[0] = -1;
  refer[1] = -1;
  if ((*(int *)((long)ctx + 0x38) == 1) && (index = *(RK_S32 *)((long)ctx + 0x88), -1 < index)) {
    mpp_buf_slot_set_flag(slots,index,SLOT_HAL_INPUT);
    *refer = index;
  }
  if (((byte)h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"out\n","mpp_h263_parser_setup_refer");
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_h263_parser_setup_refer(H263dParser ctx, RK_S32 *refer, RK_S32 max_ref)
{
    H263dParserImpl *p = (H263dParserImpl *)ctx;
    H263Hdr *hdr_curr = &p->hdr_curr;
    MppBufSlots slots = p->frame_slots;
    RK_S32 index;

    h263d_dbg_func("in\n");

    memset(refer, -1, sizeof(max_ref * sizeof(*refer)));
    if (hdr_curr->pict_type == H263_P_VOP) {
        index = p->hdr_ref0.slot_idx;
        if (index >= 0) {
            mpp_buf_slot_set_flag(slots, index, SLOT_HAL_INPUT);
            refer[0] = index;
        }
    }

    h263d_dbg_func("out\n");

    return MPP_OK;
}